

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

string * __thiscall
duckdb::PragmaImportDatabase_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  ParserOptions options_p;
  pointer puVar1;
  bool bVar2;
  uint uVar3;
  FileSystem *this_00;
  const_reference pvVar4;
  undefined4 extraout_var;
  unique_ptr<char[],_std::default_delete<char[]>_> __s;
  type pFVar5;
  pointer this_01;
  CopyStatement *pCVar6;
  type pCVar7;
  long lVar8;
  pointer b;
  pointer this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  _Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_> local_178;
  ClientContext *local_170;
  string query;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  Parser parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  string file_name;
  string file_path;
  string local_70;
  string local_50;
  ulong __n;
  
  local_170 = context;
  this_00 = FileSystem::GetFileSystem((ClientContext *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&parser,"schema.sql",(allocator *)&file_path);
  ::std::__cxx11::string::string
            ((string *)&parser.options.max_expression_depth,"load.sql",(allocator *)&query);
  __l._M_len = 2;
  __l._M_array = (iterator)&parser;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&files,__l,(allocator_type *)&file_name);
  lVar8 = 0x20;
  do {
    ::std::__cxx11::string::~string
              ((string *)
               ((long)&parser.statements.
                       super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  local_128 = files.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (b = files.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; b != local_128; b = b + 1) {
    pvVar4 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)local_170,0);
    Value::ToString_abi_cxx11_((string *)&parser,pvVar4);
    FileSystem::JoinPath(&file_path,this_00,(string *)&parser,b);
    ::std::__cxx11::string::~string((string *)&parser);
    (*this_00->_vptr_FileSystem[2])(&local_178,this_00,&file_path,1,0x100,0);
    unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
              ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
               &local_178);
    uVar3 = (*this_00->_vptr_FileSystem[8])();
    __n = CONCAT44(extraout_var,uVar3);
    __s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)operator_new__(__n);
    switchD_014c3389::default
              ((void *)__s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
    super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)
         __s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_178);
    (*this_00->_vptr_FileSystem[5])
              (this_00,pFVar5,
               buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,__n);
    query._M_dataplus._M_p = (pointer)&query.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&query,
               buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,
               (ulong)uVar3 +
               (long)buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl);
    bVar2 = ::std::operator==(b,"load.sql");
    if (bVar2) {
      local_120 = 1;
      uStack_118 = 1000;
      local_110 = 0;
      options_p.max_expression_depth = 1000;
      options_p.preserve_identifier_case = true;
      options_p.integer_division = false;
      options_p._2_6_ = 0;
      options_p.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
      Parser::Parser(&parser,options_p);
      Parser::ParseQuery(&parser,&query);
      local_148.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           parser.statements.
           super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           parser.statements.
           super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_148.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           parser.statements.
           super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      parser.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parser.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parser.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      query._M_string_length = 0;
      *query._M_dataplus._M_p = '\0';
      puVar1 = local_148.
               super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = local_148.
                     super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
          this_02 = this_02 + 1) {
        this_01 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  ::operator->(this_02);
        pCVar6 = SQLStatement::Cast<duckdb::CopyStatement>(this_01);
        pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                 operator*(&pCVar6->info);
        FileSystem::ExtractName(&file_name,this_00,&pCVar7->file_path);
        pvVar4 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)local_170,0);
        Value::ToString_abi_cxx11_(&local_70,pvVar4);
        FileSystem::JoinPath(&local_50,this_00,&local_70,&file_name);
        ::std::__cxx11::string::operator=((string *)&pCVar7->file_path,(string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        (*(pCVar6->super_SQLStatement)._vptr_SQLStatement[2])(&local_70,pCVar6);
        ::std::operator+(&local_50,&local_70,";");
        ::std::__cxx11::string::append((string *)&query);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&file_name);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector(&local_148);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&parser);
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&query);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              (&buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>);
    if (local_178.super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl !=
        (FileHandle *)0x0) {
      (**(code **)(*(long *)local_178.super__Head_base<0UL,_duckdb::FileHandle_*,_false>.
                            _M_head_impl + 8))();
    }
    ::std::__cxx11::string::~string((string *)&file_path);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&files);
  return __return_storage_ptr__;
}

Assistant:

string PragmaImportDatabase(ClientContext &context, const FunctionParameters &parameters) {
	auto &fs = FileSystem::GetFileSystem(context);

	string final_query;
	// read the "schema.sql" and "load.sql" files
	vector<string> files = {"schema.sql", "load.sql"};
	for (auto &file : files) {
		auto file_path = fs.JoinPath(parameters.values[0].ToString(), file);
		auto handle = fs.OpenFile(file_path, FileFlags::FILE_FLAGS_READ);
		auto fsize = fs.GetFileSize(*handle);
		auto buffer = make_unsafe_uniq_array<char>(UnsafeNumericCast<size_t>(fsize));
		fs.Read(*handle, buffer.get(), fsize);
		auto query = string(buffer.get(), UnsafeNumericCast<uint32_t>(fsize));
		// Replace the placeholder with the path provided to IMPORT
		if (file == "load.sql") {
			Parser parser;
			parser.ParseQuery(query);
			auto copy_statements = std::move(parser.statements);
			query.clear();
			for (auto &statement_p : copy_statements) {
				D_ASSERT(statement_p->type == StatementType::COPY_STATEMENT);
				auto &statement = statement_p->Cast<CopyStatement>();
				auto &info = *statement.info;
				auto file_name = fs.ExtractName(info.file_path);
				info.file_path = fs.JoinPath(parameters.values[0].ToString(), file_name);
				query += statement.ToString() + ";";
			}
		}
		final_query += query;
	}
	return final_query;
}